

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

void __thiscall icu_63::Calendar::clear(Calendar *this,UCalendarDateFields field)

{
  UErrorCode ec;
  
  if (this->fAreFieldsVirtuallySet != '\0') {
    (*(this->super_UObject)._vptr_UObject[0x1d])(this);
  }
  this->fFields[field] = 0;
  this->fStamp[field] = 0;
  this->fIsSet[field] = '\0';
  this->fIsTimeSet = '\0';
  this->fAreFieldsSet = '\0';
  this->fAreAllFieldsSet = '\0';
  this->fAreFieldsVirtuallySet = '\0';
  return;
}

Assistant:

void
Calendar::clear(UCalendarDateFields field)
{
    if (fAreFieldsVirtuallySet) {
        UErrorCode ec = U_ZERO_ERROR;
        computeFields(ec);
    }
    fFields[field]         = 0;
    fStamp[field]         = kUnset;
    fIsSet[field]         = FALSE; // Remove later
    fIsTimeSet = fAreFieldsSet = fAreAllFieldsSet = fAreFieldsVirtuallySet = FALSE;
}